

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::ReadCircle(ON_BinaryArchive *this,ON_Circle *circle)

{
  bool local_31;
  undefined1 local_30 [7];
  bool rc;
  ON_3dPoint scratch;
  ON_Circle *circle_local;
  ON_BinaryArchive *this_local;
  
  scratch.z = (double)circle;
  local_31 = ReadPlane(this,&circle->plane);
  if (local_31) {
    local_31 = ReadDouble(this,(double *)((long)scratch.z + 0x80));
  }
  if (local_31 != false) {
    local_31 = ReadPoint(this,(ON_3dPoint *)local_30);
  }
  if (local_31 != false) {
    local_31 = ReadPoint(this,(ON_3dPoint *)local_30);
  }
  if (local_31 != false) {
    local_31 = ReadPoint(this,(ON_3dPoint *)local_30);
  }
  return local_31;
}

Assistant:

bool 
ON_BinaryArchive::ReadCircle(ON_Circle& circle)
{
  ON_3dPoint scratch;
  bool rc = ReadPlane( circle.plane );
  if (rc)
    rc = ReadDouble( &circle.radius );
  // m_point[] removed 2001, November, 7
  if (rc)
    rc = ReadPoint( scratch );
  if (rc)
    rc = ReadPoint( scratch );
  if (rc)
    rc = ReadPoint( scratch );
  /*
  if (rc)
    rc = ReadPoint( circle.m_point[0] );
  if (rc)
    rc = ReadPoint( circle.m_point[1] );
  if (rc)
    rc = ReadPoint( circle.m_point[2] );
  */
  return rc;
}